

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_idict * stb_idict_copy(stb_idict *a)

{
  int iVar1;
  stb_idict *h;
  int i;
  stb_idict *a_local;
  
  a_local = (stb_idict *)malloc(0x38);
  if (a_local == (stb_idict *)0x0) {
    a_local = (stb_idict *)0x0;
  }
  else {
    iVar1 = stb_idict_init(a_local,a->limit);
    if (iVar1 == 0) {
      free(a_local);
      a_local = (stb_idict *)0x0;
    }
    else {
      a_local->count = a->count;
      a_local->deleted = a->deleted;
      a_local->alloced = '\x01';
      a_local->ev = a->ev;
      a_local->dv = a->dv;
      a_local->has_empty = a->has_empty;
      a_local->has_del = a->has_del;
      memcpy(a_local->table,a->table,(long)a_local->limit << 3);
      for (h._4_4_ = 0; h._4_4_ < a->limit; h._4_4_ = h._4_4_ + 1) {
        if ((a_local->table[h._4_4_].k != 1) && (a_local->table[h._4_4_].k != 3)) {
          a_local->table[h._4_4_].k = a_local->table[h._4_4_].k;
        }
      }
    }
  }
  return a_local;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}